

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CampaignReader.cpp
# Opt level: O2

bool __thiscall
adios2::core::engine::CampaignReader::VariableMinMax
          (CampaignReader *this,VariableBase *Var,size_t Step,MinMaxStruct *MinMax)

{
  Engine *pEVar1;
  int iVar2;
  iterator iVar3;
  
  iVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignReader::VarInternalInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignReader::VarInternalInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->m_VarInternalInfo)._M_h,&Var->m_Name);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignReader::VarInternalInfo>,_true>
      ._M_cur != (__node_type *)0x0) {
    pEVar1 = (this->m_Engines).
             super__Vector_base<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>.
             _M_impl.super__Vector_impl_data._M_start
             [*(long *)((long)iVar3.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignReader::VarInternalInfo>,_true>
                              ._M_cur + 0x38)];
    iVar2 = (*pEVar1->_vptr_Engine[0xe])
                      (pEVar1,*(undefined8 *)
                               ((long)iVar3.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignReader::VarInternalInfo>,_true>
                                      ._M_cur + 0x28),Step,MinMax);
    return SUB41(iVar2,0);
  }
  return false;
}

Assistant:

bool CampaignReader::VariableMinMax(const VariableBase &Var, const size_t Step,
                                    MinMaxStruct &MinMax)
{
    auto it = m_VarInternalInfo.find(Var.m_Name);
    if (it != m_VarInternalInfo.end())
    {
        VariableBase *vb = reinterpret_cast<VariableBase *>(it->second.originalVar);
        Engine *e = m_Engines[it->second.engineIdx];
        return e->VariableMinMax(*vb, Step, MinMax);
    }
    return false;
}